

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

_Bool bitsets_disjoint(bitset_t *b1,bitset_t *b2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = b2->arraysize;
  if (b1->arraysize < b2->arraysize) {
    uVar2 = b1->arraysize;
  }
  if (uVar2 != 0) {
    if ((*b1->array & *b2->array) == 0) {
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if (uVar2 == uVar3) break;
        uVar1 = uVar3 + 1;
      } while ((b1->array[uVar3] & b2->array[uVar3]) == 0);
      return uVar2 <= uVar3;
    }
  }
  return uVar2 == 0;
}

Assistant:

bool bitsets_disjoint(const bitset_t *CROARING_CBITSET_RESTRICT b1,
                      const bitset_t *CROARING_CBITSET_RESTRICT b2) {
    size_t minlength =
        b1->arraysize < b2->arraysize ? b1->arraysize : b2->arraysize;

    for (size_t k = 0; k < minlength; k++) {
        if ((b1->array[k] & b2->array[k]) != 0) return false;
    }
    return true;
}